

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvex2dConvex2dAlgorithm.h
# Opt level: O0

btCollisionAlgorithm * __thiscall
btConvex2dConvex2dAlgorithm::CreateFunc::CreateCollisionAlgorithm
          (CreateFunc *this,btCollisionAlgorithmConstructionInfo *ci,
          btCollisionObjectWrapper *body0Wrap,btCollisionObjectWrapper *body1Wrap)

{
  btConvex2dConvex2dAlgorithm *this_00;
  btConvexPenetrationDepthSolver *in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  btPersistentManifold *in_RDI;
  void *mem;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffbc;
  btCollisionAlgorithmConstructionInfo *in_stack_ffffffffffffffc0;
  
  this_00 = (btConvex2dConvex2dAlgorithm *)
            (**(code **)(*(long *)*in_RSI + 0x70))((long *)*in_RSI,0x38);
  btConvex2dConvex2dAlgorithm
            (this_00,in_RDI,in_stack_ffffffffffffffc0,
             (btCollisionObjectWrapper *)
             CONCAT44(in_stack_ffffffffffffffbc,in_RDI->m_pointCache[0].m_localPointB.m_floats[3]),
             (btCollisionObjectWrapper *)
             CONCAT44(in_stack_ffffffffffffffb4,in_RDI->m_pointCache[0].m_localPointB.m_floats[2]),
             *(btVoronoiSimplexSolver **)(in_RDI->m_pointCache[0].m_localPointA.m_floats + 2),in_RCX
             ,in_EDX,(int)in_RSI);
  return (btCollisionAlgorithm *)this_00;
}

Assistant:

virtual	btCollisionAlgorithm* CreateCollisionAlgorithm(btCollisionAlgorithmConstructionInfo& ci, const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap)
		{
			void* mem = ci.m_dispatcher1->allocateCollisionAlgorithm(sizeof(btConvex2dConvex2dAlgorithm));
			return new(mem) btConvex2dConvex2dAlgorithm(ci.m_manifold,ci,body0Wrap,body1Wrap,m_simplexSolver,m_pdSolver,m_numPerturbationIterations,m_minimumPointsPerturbationThreshold);
		}